

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_MIRP(TT_ExecContext exc,FT_Long *args)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  FT_ULong FVar4;
  long lVar5;
  ushort uVar6;
  FT_Int32 FVar7;
  FT_Vector *pFVar8;
  ulong uVar9;
  FT_F26Dot6 FVar10;
  FT_Vector *pFVar11;
  long local_78;
  long local_60;
  FT_F26Dot6 minimum_distance;
  FT_F26Dot6 control_value_cutin;
  FT_F26Dot6 org_dist;
  FT_F26Dot6 cur_dist;
  FT_F26Dot6 distance;
  FT_F26Dot6 cvt_dist;
  FT_ULong cvtEntry;
  FT_UShort point;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  lVar1 = (exc->GS).minimum_distance;
  lVar2 = (exc->GS).control_value_cutin;
  uVar3 = *args;
  uVar6 = (ushort)uVar3;
  FVar4 = args[1];
  if (((uVar6 < (exc->zp1).n_points) && (FVar4 + 1 < exc->cvtSize + 1)) &&
     ((exc->GS).rp0 < (exc->zp0).n_points)) {
    if (FVar4 == 0xffffffffffffffff) {
      distance = 0;
    }
    else {
      distance = (*exc->func_read_cvt)(exc,FVar4);
    }
    if (distance - (exc->GS).single_width_value < 0) {
      local_60 = -(distance - (exc->GS).single_width_value);
    }
    else {
      local_60 = distance - (exc->GS).single_width_value;
    }
    if (local_60 < (exc->GS).single_width_cutin) {
      if (distance < 0) {
        distance = -(exc->GS).single_width_value;
      }
      else {
        distance = (exc->GS).single_width_value;
      }
    }
    if ((exc->GS).gep1 == 0) {
      lVar5 = (exc->zp0).org[(exc->GS).rp0].x;
      FVar7 = TT_MulFix14_long_long((FT_Int32)distance,(int)(exc->GS).freeVector.x);
      (exc->zp1).org[uVar3 & 0xffff].x = lVar5 + FVar7;
      lVar5 = (exc->zp0).org[(exc->GS).rp0].y;
      FVar7 = TT_MulFix14_long_long((FT_Int32)distance,(int)(exc->GS).freeVector.y);
      (exc->zp1).org[uVar3 & 0xffff].y = lVar5 + FVar7;
      pFVar8 = (exc->zp1).cur + (uVar3 & 0xffff);
      pFVar11 = (exc->zp1).org + (uVar3 & 0xffff);
      pFVar8->x = pFVar11->x;
      pFVar8->y = pFVar11->y;
    }
    uVar9 = (*exc->func_dualproj)
                      (exc,(exc->zp1).org[uVar3 & 0xffff].x - (exc->zp0).org[(exc->GS).rp0].x,
                       (exc->zp1).org[uVar3 & 0xffff].y - (exc->zp0).org[(exc->GS).rp0].y);
    FVar10 = (*exc->func_project)
                       (exc,(exc->zp1).cur[uVar3 & 0xffff].x - (exc->zp0).cur[(exc->GS).rp0].x,
                        (exc->zp1).cur[uVar3 & 0xffff].y - (exc->zp0).cur[(exc->GS).rp0].y);
    if (((exc->GS).auto_flip != '\0') && ((long)(uVar9 ^ distance) < 0)) {
      distance = -distance;
    }
    if ((exc->opcode & 4) == 0) {
      cur_dist = Round_None(exc,distance,(exc->tt_metrics).compensations[(int)(exc->opcode & 3)]);
    }
    else {
      if ((exc->GS).gep0 == (exc->GS).gep1) {
        if ((long)(distance - uVar9) < 0) {
          local_78 = -(distance - uVar9);
        }
        else {
          local_78 = distance - uVar9;
        }
        if (lVar2 < local_78) {
          distance = uVar9;
        }
      }
      cur_dist = (*exc->func_round)(exc,distance,
                                    (exc->tt_metrics).compensations[(int)(exc->opcode & 3)]);
    }
    if ((exc->opcode & 8) != 0) {
      if ((long)uVar9 < 0) {
        if (-lVar1 < cur_dist) {
          cur_dist = -lVar1;
        }
      }
      else if (cur_dist < lVar1) {
        cur_dist = lVar1;
      }
    }
    (*exc->func_move)(exc,&exc->zp1,uVar6,cur_dist - FVar10);
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  (exc->GS).rp1 = (exc->GS).rp0;
  if ((exc->opcode & 0x10) != 0) {
    (exc->GS).rp0 = uVar6;
  }
  (exc->GS).rp2 = uVar6;
  return;
}

Assistant:

static void
  Ins_MIRP( TT_ExecContext  exc,
            FT_Long*        args )
  {
    FT_UShort   point;
    FT_ULong    cvtEntry;

    FT_F26Dot6  cvt_dist,
                distance,
                cur_dist,
                org_dist,
                control_value_cutin,
                minimum_distance;
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    FT_Int      B1           = 0; /* pacify compiler */
    FT_Int      B2           = 0;
    FT_Bool     reverse_move = FALSE;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */


    minimum_distance    = exc->GS.minimum_distance;
    control_value_cutin = exc->GS.control_value_cutin;
    point               = (FT_UShort)args[0];
    cvtEntry            = (FT_ULong)( args[1] + 1 );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY                        &&
         exc->ignore_x_mode                                 &&
         exc->GS.freeVector.x != 0                          &&
         !( exc->sph_tweak_flags & SPH_TWEAK_NORMAL_ROUND ) )
      control_value_cutin = minimum_distance = 0;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    /* XXX: UNDOCUMENTED! cvt[-1] = 0 always */

    if ( BOUNDS( point,       exc->zp1.n_points ) ||
         BOUNDSL( cvtEntry,   exc->cvtSize + 1 )  ||
         BOUNDS( exc->GS.rp0, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      goto Fail;
    }

    if ( !cvtEntry )
      cvt_dist = 0;
    else
      cvt_dist = exc->func_read_cvt( exc, cvtEntry - 1 );

    /* single width test */

    if ( FT_ABS( cvt_dist - exc->GS.single_width_value ) <
         exc->GS.single_width_cutin )
    {
      if ( cvt_dist >= 0 )
        cvt_dist =  exc->GS.single_width_value;
      else
        cvt_dist = -exc->GS.single_width_value;
    }

    /* UNDOCUMENTED!  The MS rasterizer does that with */
    /* twilight points (confirmed by Greg Hitchcock)   */
    if ( exc->GS.gep1 == 0 )
    {
      exc->zp1.org[point].x = exc->zp0.org[exc->GS.rp0].x +
                              TT_MulFix14( cvt_dist,
                                           exc->GS.freeVector.x );
      exc->zp1.org[point].y = exc->zp0.org[exc->GS.rp0].y +
                              TT_MulFix14( cvt_dist,
                                           exc->GS.freeVector.y );
      exc->zp1.cur[point]   = exc->zp1.org[point];
    }

    org_dist = DUALPROJ( &exc->zp1.org[point], &exc->zp0.org[exc->GS.rp0] );
    cur_dist = PROJECT ( &exc->zp1.cur[point], &exc->zp0.cur[exc->GS.rp0] );

    /* auto-flip test */

    if ( exc->GS.auto_flip )
    {
      if ( ( org_dist ^ cvt_dist ) < 0 )
        cvt_dist = -cvt_dist;
    }

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY                               &&
         exc->ignore_x_mode                                        &&
         exc->GS.freeVector.y != 0                                 &&
         ( exc->sph_tweak_flags & SPH_TWEAK_TIMES_NEW_ROMAN_HACK ) )
    {
      if ( cur_dist < -64 )
        cvt_dist -= 16;
      else if ( cur_dist > 64 && cur_dist < 84 )
        cvt_dist += 32;
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    /* control value cut-in and round */

    if ( ( exc->opcode & 4 ) != 0 )
    {
      /* XXX: UNDOCUMENTED!  Only perform cut-in test when both points */
      /*      refer to the same zone.                                  */

      if ( exc->GS.gep0 == exc->GS.gep1 )
      {
        /* XXX: According to Greg Hitchcock, the following wording is */
        /*      the right one:                                        */
        /*                                                            */
        /*        When the absolute difference between the value in   */
        /*        the table [CVT] and the measurement directly from   */
        /*        the outline is _greater_ than the cut_in value, the */
        /*        outline measurement is used.                        */
        /*                                                            */
        /*      This is from `instgly.doc'.  The description in       */
        /*      `ttinst2.doc', version 1.66, is thus incorrect since  */
        /*      it implies `>=' instead of `>'.                       */

        if ( FT_ABS( cvt_dist - org_dist ) > control_value_cutin )
          cvt_dist = org_dist;
      }

      distance = exc->func_round(
                   exc,
                   cvt_dist,
                   exc->tt_metrics.compensations[exc->opcode & 3] );
    }
    else
    {

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      /* do cvt cut-in always in MIRP for sph */
      if ( SUBPIXEL_HINTING_INFINALITY  &&
           exc->ignore_x_mode           &&
           exc->GS.gep0 == exc->GS.gep1 )
      {
        if ( FT_ABS( cvt_dist - org_dist ) > control_value_cutin )
          cvt_dist = org_dist;
      }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      distance = Round_None(
                   exc,
                   cvt_dist,
                   exc->tt_metrics.compensations[exc->opcode & 3] );
    }

    /* minimum distance test */

    if ( ( exc->opcode & 8 ) != 0 )
    {
      if ( org_dist >= 0 )
      {
        if ( distance < minimum_distance )
          distance = minimum_distance;
      }
      else
      {
        if ( distance > NEG_LONG( minimum_distance ) )
          distance = NEG_LONG( minimum_distance );
      }
    }

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY )
    {
      B1 = exc->zp1.cur[point].y;

      /* Round moves if necessary */
      if ( exc->ignore_x_mode                                          &&
           exc->GS.freeVector.y != 0                                   &&
           ( exc->sph_tweak_flags & SPH_TWEAK_ROUND_NONPIXEL_Y_MOVES ) )
        distance = FT_PIX_ROUND( B1 + distance - cur_dist ) - B1 + cur_dist;

      if ( exc->ignore_x_mode                                      &&
           exc->GS.freeVector.y != 0                               &&
           ( exc->opcode & 16 ) == 0                               &&
           ( exc->opcode & 8 ) == 0                                &&
           ( exc->sph_tweak_flags & SPH_TWEAK_COURIER_NEW_2_HACK ) )
        distance += 64;
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    exc->func_move( exc,
                    &exc->zp1,
                    point,
                    SUB_LONG( distance, cur_dist ) );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY )
    {
      B2 = exc->zp1.cur[point].y;

      /* Reverse move if necessary */
      if ( exc->ignore_x_mode )
      {
        if ( exc->face->sph_compatibility_mode &&
             exc->GS.freeVector.y != 0         &&
             ( B1 & 63 ) == 0                  &&
             ( B2 & 63 ) != 0                  )
          reverse_move = TRUE;

        if ( ( exc->sph_tweak_flags & SPH_TWEAK_SKIP_NONPIXEL_Y_MOVES ) &&
             exc->GS.freeVector.y != 0                                  &&
             ( B2 & 63 ) != 0                                           &&
             ( B1 & 63 ) != 0                                           )
          reverse_move = TRUE;
      }

      if ( reverse_move )
        exc->func_move( exc,
                        &exc->zp1,
                        point,
                        SUB_LONG( cur_dist, distance ) );
    }

#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

  Fail:
    exc->GS.rp1 = exc->GS.rp0;

    if ( ( exc->opcode & 16 ) != 0 )
      exc->GS.rp0 = point;

    exc->GS.rp2 = point;
  }